

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbaselib.cpp
# Opt level: O3

int luaB_collectgarbage(lua_State *L)

{
  int iVar1;
  int b;
  lua_Integer lVar2;
  lua_Number n;
  
  iVar1 = luaL_checkoption(L,1,"collect",luaB_collectgarbage::opts);
  lVar2 = luaL_optinteger(L,2,0);
  iVar1 = luaB_collectgarbage::optsnum[iVar1];
  b = lua_gc(L,iVar1,(int)lVar2);
  if (iVar1 == 5) {
    lua_pushboolean(L,b);
  }
  else {
    if (iVar1 == 3) {
      iVar1 = lua_gc(L,4,0);
      n = (double)iVar1 * 0.0009765625 + (double)b;
    }
    else {
      n = (lua_Number)b;
    }
    lua_pushnumber(L,n);
  }
  return 1;
}

Assistant:

static int luaB_collectgarbage (lua_State *L) {
  static const char *const opts[] = {"stop", "restart", "collect",
    "count", "step", "setpause", "setstepmul", NULL};
  static const int optsnum[] = {LUA_GCSTOP, LUA_GCRESTART, LUA_GCCOLLECT,
    LUA_GCCOUNT, LUA_GCSTEP, LUA_GCSETPAUSE, LUA_GCSETSTEPMUL};
  int o = luaL_checkoption(L, 1, "collect", opts);
  int ex = luaL_optint(L, 2, 0);
  int res = lua_gc(L, optsnum[o], ex);
  switch (optsnum[o]) {
    case LUA_GCCOUNT: {
      int b = lua_gc(L, LUA_GCCOUNTB, 0);
      lua_pushnumber(L, res + ((lua_Number)b/1024));
      return 1;
    }
    case LUA_GCSTEP: {
      lua_pushboolean(L, res);
      return 1;
    }
    default: {
      lua_pushnumber(L, res);
      return 1;
    }
  }
}